

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

bool __thiscall cmELF::GetSOName(cmELF *this,string *soname)

{
  cmELFInternal *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  pcVar1 = this->Internal;
  if ((pcVar1 == (cmELFInternal *)0x0) || (pcVar1->ELFType != FileTypeSharedLibrary)) {
    lVar3 = 0;
  }
  else {
    iVar2 = (*pcVar1->_vptr_cmELFInternal[5])(pcVar1,0xe);
    lVar3 = CONCAT44(extraout_var,iVar2);
  }
  if (lVar3 != 0) {
    std::__cxx11::string::_M_assign((string *)soname);
  }
  return lVar3 != 0;
}

Assistant:

bool cmELF::GetSOName(std::string& soname)
{
  if(StringEntry const* se = this->GetSOName())
    {
    soname = se->Value;
    return true;
    }
  else
    {
    return false;
    }
}